

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  uchar uVar1;
  byte bVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  cJSON_bool cVar7;
  long lVar8;
  ulong uVar9;
  cJSON *item_00;
  cJSON *pcVar10;
  cJSON *item_01;
  cJSON *pcVar11;
  double dVar12;
  uchar *after_end;
  uchar number_c_string [64];
  byte *local_80;
  byte local_78 [72];
  
  if (input_buffer == (parse_buffer *)0x0) {
    return 0;
  }
  puVar3 = input_buffer->content;
  if (puVar3 == (uchar *)0x0) {
    return 0;
  }
  uVar4 = input_buffer->length;
  uVar5 = input_buffer->offset;
  uVar9 = uVar5 + 4;
  if ((uVar4 < uVar9) || (iVar6 = strncmp((char *)(puVar3 + uVar5),"null",4), iVar6 != 0)) {
    if ((uVar5 + 5 <= uVar4) && (iVar6 = strncmp((char *)(puVar3 + uVar5),"false",5), iVar6 == 0)) {
      item->type = 1;
      input_buffer->offset = uVar5 + 5;
      return 1;
    }
    if ((uVar4 < uVar9) || (iVar6 = strncmp((char *)(puVar3 + uVar5),"true",4), iVar6 != 0)) {
      if (uVar5 < uVar4) {
        uVar1 = puVar3[uVar5];
        if (uVar1 == '\"') {
          cVar7 = parse_string(item,input_buffer);
          return cVar7;
        }
        if (uVar1 == '-' || (byte)(uVar1 - 0x30) < 10) {
          local_80 = (byte *)0x0;
          lVar8 = 0;
          do {
            if ((uVar4 <= uVar5 + lVar8) ||
               ((bVar2 = (puVar3 + uVar5)[lVar8], 9 < bVar2 - 0x30 &&
                ((0x3a < bVar2 - 0x2b ||
                 ((0x40000000400000dU >> ((ulong)(bVar2 - 0x2b) & 0x3f) & 1) == 0))))))
            goto LAB_0011e251;
            local_78[lVar8] = bVar2;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x3f);
          lVar8 = 0x3f;
LAB_0011e251:
          local_78[lVar8] = 0;
          dVar12 = strtod((char *)local_78,(char **)&local_80);
          if (local_78 != local_80) {
            item->valuedouble = dVar12;
            iVar6 = 0x7fffffff;
            if ((dVar12 < 2147483647.0) && (iVar6 = -0x80000000, -2147483648.0 < dVar12)) {
              iVar6 = (int)dVar12;
            }
            item->valueint = iVar6;
            item->type = 8;
            input_buffer->offset = (size_t)(local_80 + (input_buffer->offset - (long)local_78));
            return 1;
          }
        }
        else {
          if (uVar1 == '{') {
            cVar7 = parse_object(item,input_buffer);
            return cVar7;
          }
          if (((uVar1 == '[') && (input_buffer->depth < 1000)) &&
             (input_buffer->depth = input_buffer->depth + 1, puVar3[uVar5] == '[')) {
            input_buffer->offset = uVar5 + 1;
            buffer_skip_whitespace(input_buffer);
            uVar9 = input_buffer->offset;
            if (uVar9 < input_buffer->length) {
              if (input_buffer->content[uVar9] == ']') {
                item_01 = (cJSON *)0x0;
              }
              else {
                input_buffer->offset = uVar9 - 1;
                pcVar10 = (cJSON *)0x0;
                pcVar11 = (cJSON *)0x0;
                do {
                  item_00 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
                  if (item_00 == (cJSON *)0x0) {
                    item_01 = pcVar11;
                    if (pcVar11 == (cJSON *)0x0) {
                      return 0;
                    }
                    goto LAB_0011e3ff;
                  }
                  item_00->valuedouble = 0.0;
                  item_00->string = (char *)0x0;
                  item_00->valuestring = (char *)0x0;
                  *(undefined8 *)&item_00->valueint = 0;
                  item_00->child = (cJSON *)0x0;
                  *(undefined8 *)&item_00->type = 0;
                  item_00->next = (cJSON *)0x0;
                  item_00->prev = (cJSON *)0x0;
                  item_01 = item_00;
                  if (pcVar11 != (cJSON *)0x0) {
                    pcVar10->next = item_00;
                    item_00->prev = pcVar10;
                    item_01 = pcVar11;
                  }
                  input_buffer->offset = input_buffer->offset + 1;
                  buffer_skip_whitespace(input_buffer);
                  cVar7 = parse_value(item_00,input_buffer);
                  if (cVar7 == 0) goto LAB_0011e3ff;
                  buffer_skip_whitespace(input_buffer);
                  uVar9 = input_buffer->offset;
                  if (input_buffer->length <= uVar9) goto LAB_0011e3ff;
                  pcVar10 = item_00;
                  pcVar11 = item_01;
                } while (input_buffer->content[uVar9] == ',');
                if (input_buffer->content[uVar9] != ']') {
LAB_0011e3ff:
                  cJSON_Delete(item_01);
                  return 0;
                }
              }
              input_buffer->depth = input_buffer->depth - 1;
              item->type = 0x20;
              item->child = item_01;
              input_buffer->offset = uVar9 + 1;
              return 1;
            }
            input_buffer->offset = uVar9 - 1;
          }
        }
      }
      return 0;
    }
    item->type = 2;
    item->valueint = 1;
  }
  else {
    item->type = 4;
  }
  input_buffer->offset = uVar9;
  return 1;
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }

    return false;
}